

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTime.c
# Opt level: O0

float Map_MatchComputeReqTimes(Map_Cut_t *pCut,int fPhase,Map_Time_t *ptArrRes)

{
  uint uVar1;
  Map_Super_t *pMVar2;
  Map_Time_t *pMVar3;
  float fVar4;
  float local_44;
  int local_3c;
  float tDelay;
  int i;
  int fPinPhase;
  uint uPhaseTot;
  Map_Super_t *pSuper;
  Map_Time_t *ptArrIn;
  Map_Time_t *ptArrRes_local;
  int fPhase_local;
  Map_Cut_t *pCut_local;
  
  pMVar2 = pCut->M[fPhase].pSuperBest;
  uVar1 = pCut->M[fPhase].uPhaseBest;
  ptArrRes->Fall = -3.4028235e+37;
  ptArrRes->Rise = -3.4028235e+37;
  for (local_3c = 0; local_3c < pCut->nLeaves; local_3c = local_3c + 1) {
    pMVar3 = pCut->ppLeaves[local_3c]->tRequired +
             (int)(uint)((uVar1 & 1 << ((byte)local_3c & 0x1f)) == 0);
    if ((0.0 < pMVar2->tDelaysR[local_3c].Rise) &&
       (fVar4 = pMVar3->Rise + pMVar2->tDelaysR[local_3c].Rise, ptArrRes->Rise < fVar4)) {
      ptArrRes->Rise = fVar4;
    }
    if ((0.0 < pMVar2->tDelaysR[local_3c].Fall) &&
       (fVar4 = pMVar3->Fall + pMVar2->tDelaysR[local_3c].Fall, ptArrRes->Rise < fVar4)) {
      ptArrRes->Rise = fVar4;
    }
    if ((0.0 < pMVar2->tDelaysF[local_3c].Rise) &&
       (fVar4 = pMVar3->Rise + pMVar2->tDelaysF[local_3c].Rise, ptArrRes->Fall < fVar4)) {
      ptArrRes->Fall = fVar4;
    }
    if ((0.0 < pMVar2->tDelaysF[local_3c].Fall) &&
       (fVar4 = pMVar3->Fall + pMVar2->tDelaysF[local_3c].Fall, ptArrRes->Fall < fVar4)) {
      ptArrRes->Fall = fVar4;
    }
  }
  if (ptArrRes->Rise < ptArrRes->Fall || ptArrRes->Rise == ptArrRes->Fall) {
    local_44 = ptArrRes->Fall;
  }
  else {
    local_44 = ptArrRes->Rise;
  }
  return local_44;
}

Assistant:

float Map_MatchComputeReqTimes( Map_Cut_t * pCut, int fPhase, Map_Time_t * ptArrRes )
{
    Map_Time_t * ptArrIn;
    Map_Super_t * pSuper;
    unsigned uPhaseTot;
    int fPinPhase, i;
    float tDelay;

    // get the supergate and the phase
    pSuper = pCut->M[fPhase].pSuperBest;
    uPhaseTot = pCut->M[fPhase].uPhaseBest;

    // propagate the arrival times 
    ptArrRes->Rise = ptArrRes->Fall = -MAP_FLOAT_LARGE;
    for ( i = 0; i < pCut->nLeaves; i++ )
    {
        // get the phase of the given pin
        fPinPhase = ((uPhaseTot & (1 << i)) == 0);
        ptArrIn = pCut->ppLeaves[i]->tRequired + fPinPhase;
//        assert( ptArrIn->Worst < MAP_FLOAT_LARGE );

        // get the rise of the output due to rise of the inputs
        if ( pSuper->tDelaysR[i].Rise > 0 )
        {
            tDelay = ptArrIn->Rise + pSuper->tDelaysR[i].Rise;
            if ( ptArrRes->Rise < tDelay )
                ptArrRes->Rise = tDelay;
        }

        // get the rise of the output due to fall of the inputs
        if ( pSuper->tDelaysR[i].Fall > 0 )
        {
            tDelay = ptArrIn->Fall + pSuper->tDelaysR[i].Fall;
            if ( ptArrRes->Rise < tDelay )
                ptArrRes->Rise = tDelay;
        }

        // get the fall of the output due to rise of the inputs
        if ( pSuper->tDelaysF[i].Rise > 0 )
        {
            tDelay = ptArrIn->Rise + pSuper->tDelaysF[i].Rise;
            if ( ptArrRes->Fall < tDelay )
                ptArrRes->Fall = tDelay;
        }

        // get the fall of the output due to fall of the inputs
        if ( pSuper->tDelaysF[i].Fall > 0 )
        {
            tDelay = ptArrIn->Fall + pSuper->tDelaysF[i].Fall;
            if ( ptArrRes->Fall < tDelay )
                ptArrRes->Fall = tDelay;
        }
    }
    // return the worst-case of rise/fall arrival times
    return MAP_MAX(ptArrRes->Rise, ptArrRes->Fall);
}